

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  ushort uVar1;
  StorageType_conflict SVar2;
  uint uVar3;
  ulong uVar4;
  StorageType_conflict1 SVar5;
  ulong uVar6;
  
  uVar1 = other->m_value;
  uVar4 = (ulong)uVar1;
  if ((uVar1 & 0x7fff) == 0x7c00) {
LAB_00930d42:
    SVar5 = ((ulong)(-1 < (short)uVar1) << 0x3f) + 0xfff0000000000000;
  }
  else {
    if ((~uVar1 & 0x7c00) == 0 && (uVar1 & 0x3ff) != 0) {
      return (Float<unsigned_long,_11,_52,_1023,_3U>)0x7fffffffffffffff;
    }
    if ((uVar1 & 0x7fff) != 0) {
      uVar3 = Float<unsigned_short,_5,_10,_15,_3U>::exponent(other);
      SVar2 = Float<unsigned_short,_5,_10,_15,_3U>::mantissa(other);
      for (uVar4 = (ulong)SVar2; ((uint)uVar4 >> 10 & 1) == 0; uVar4 = uVar4 * 2) {
        uVar3 = uVar3 - 1;
      }
      uVar6 = (ulong)(uVar1 >> 0xf) << 0x3f;
      if (-0x3ff < (int)uVar3) {
        if ((int)uVar3 < 0x400) {
          return (Float<unsigned_long,_11,_52,_1023,_3U>)
                 (uVar6 | (ulong)(uVar3 + 0x3ff) << 0x34 | (ulong)((uint)uVar4 & 0x3ffbff) << 0x2a);
        }
        uVar1 = other->m_value;
        goto LAB_00930d42;
      }
      if (0xfffffbcc < uVar3) {
        return (Float<unsigned_long,_11,_52,_1023,_3U>)
               (uVar6 | ~(-1L << (-(char)uVar3 - 0x29U & 0x3f)) + uVar4 +
                        (ulong)((uVar4 >> ((ulong)(-uVar3 - 0x428) & 0x3f) & 1) != 0) >>
                        ((byte)(-uVar3 - 0x428) & 0x3f));
      }
      uVar4 = (ulong)(other->m_value & 0x8000);
    }
    SVar5 = uVar4 << 0x30;
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)SVar5;
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}